

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DefineDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefineDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::MacroFormalArgumentListSyntax*&,std::span<slang::parsing::Token,18446744073709551615ul>>
          (BumpAllocator *this,Token *args,Token *args_1,MacroFormalArgumentListSyntax **args_2,
          span<slang::parsing::Token,_18446744073709551615UL> *args_3)

{
  span<slang::parsing::Token,_18446744073709551615UL> elements;
  Token name;
  DefineDirectiveSyntax *formalArguments;
  undefined8 *in_RCX;
  size_t *in_R8;
  size_t in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  __extent_storage<18446744073709551615UL> this_00;
  BumpAllocator *in_stack_ffffffffffffff78;
  size_t sVar1;
  Info *in_stack_ffffffffffffff80;
  Token in_stack_ffffffffffffff88;
  TokenList *in_stack_ffffffffffffffa0;
  
  formalArguments =
       (DefineDirectiveSyntax *)
       allocate(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  this_00._M_extent_value = *in_R8;
  sVar1 = in_R8[1];
  elements._M_extent._M_extent_value = this_00._M_extent_value;
  elements._M_ptr = (pointer)formalArguments;
  slang::syntax::TokenList::TokenList((TokenList *)*in_RCX,elements);
  name.info = in_stack_ffffffffffffff80;
  name.kind = (short)sVar1;
  name._2_1_ = (char)(sVar1 >> 0x10);
  name.numFlags.raw = (char)(sVar1 >> 0x18);
  name.rawLen = (int)(sVar1 >> 0x20);
  slang::syntax::DefineDirectiveSyntax::DefineDirectiveSyntax
            ((DefineDirectiveSyntax *)this_00._M_extent_value,in_stack_ffffffffffffff88,name,
             (MacroFormalArgumentListSyntax *)formalArguments,in_stack_ffffffffffffffa0);
  return formalArguments;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }